

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O0

bool __thiscall
spvtools::EnumSet<spv::Capability>::HasAnyOf
          (EnumSet<spv::Capability> *this,EnumSet<spv::Capability> *in_set)

{
  Capability CVar1;
  ulong uVar2;
  bool bVar3;
  pointer pBVar4;
  bool local_69;
  __normal_iterator<const_spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
  local_40;
  __normal_iterator<const_spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
  local_38;
  __normal_iterator<const_spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
  local_30;
  const_iterator rhs;
  const_iterator lhs;
  EnumSet<spv::Capability> *in_set_local;
  EnumSet<spv::Capability> *this_local;
  
  bVar3 = empty(in_set);
  if (!bVar3) {
    rhs = std::
          vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
          ::cbegin(&this->buckets_);
    local_30._M_current =
         (Bucket *)
         std::
         vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
         ::cbegin(&in_set->buckets_);
    while( true ) {
      while( true ) {
        local_38._M_current =
             (Bucket *)
             std::
             vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
             ::cend(&this->buckets_);
        bVar3 = __gnu_cxx::operator!=(&rhs,&local_38);
        local_69 = false;
        if (bVar3) {
          local_40._M_current =
               (Bucket *)
               std::
               vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
               ::cend(&in_set->buckets_);
          local_69 = __gnu_cxx::operator!=(&local_30,&local_40);
        }
        if (local_69 == false) {
          return false;
        }
        pBVar4 = __gnu_cxx::
                 __normal_iterator<const_spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
                 ::operator->(&rhs);
        CVar1 = pBVar4->start;
        pBVar4 = __gnu_cxx::
                 __normal_iterator<const_spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
                 ::operator->(&local_30);
        if (CVar1 == pBVar4->start) break;
        pBVar4 = __gnu_cxx::
                 __normal_iterator<const_spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
                 ::operator->(&rhs);
        CVar1 = pBVar4->start;
        pBVar4 = __gnu_cxx::
                 __normal_iterator<const_spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
                 ::operator->(&local_30);
        if (CVar1 < pBVar4->start) {
          __gnu_cxx::
          __normal_iterator<const_spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
          ::operator++(&rhs,0);
        }
        else {
          __gnu_cxx::
          __normal_iterator<const_spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
          ::operator++(&local_30,0);
        }
      }
      pBVar4 = __gnu_cxx::
               __normal_iterator<const_spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
               ::operator->(&rhs);
      uVar2 = pBVar4->data;
      pBVar4 = __gnu_cxx::
               __normal_iterator<const_spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
               ::operator->(&local_30);
      if ((uVar2 & pBVar4->data) != 0) break;
      __gnu_cxx::
      __normal_iterator<const_spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
      ::operator++(&rhs,0);
      __gnu_cxx::
      __normal_iterator<const_spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
      ::operator++(&local_30,0);
    }
  }
  return true;
}

Assistant:

bool HasAnyOf(const EnumSet<T>& in_set) const {
    if (in_set.empty()) {
      return true;
    }

    auto lhs = buckets_.cbegin();
    auto rhs = in_set.buckets_.cbegin();

    while (lhs != buckets_.cend() && rhs != in_set.buckets_.cend()) {
      if (lhs->start == rhs->start) {
        if (lhs->data & rhs->data) {
          // At least 1 bit is shared. Early return.
          return true;
        }

        lhs++;
        rhs++;
        continue;
      }

      // LHS bucket is smaller than the current RHS bucket. Catching up on RHS.
      if (lhs->start < rhs->start) {
        lhs++;
        continue;
      }

      // Otherwise, RHS needs to catch up on LHS.
      rhs++;
    }

    return false;
  }